

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O0

xml_node __thiscall
NULLCPugiXML::xml_node__first_element_by_path
          (NULLCPugiXML *this,NULLCArray path,char delimiter,xml_node *ptr)

{
  undefined7 in_register_00000009;
  xml_node *ptr_local;
  char delimiter_local;
  NULLCArray path_local;
  xml_node ret;
  
  path_local.ptr._0_4_ = path.ptr._0_4_;
  if (this == (NULLCPugiXML *)0x0) {
    nullcThrowError("path is empty");
    memset((void *)((long)&path_local.ptr + 4),0,8);
    xml_node::xml_node((xml_node *)((long)&path_local.ptr + 4));
  }
  else {
    xml_node::xml_node((xml_node *)((long)&path_local.ptr + 4));
    path_local._4_8_ =
         pugi::xml_node::first_element_by_path
                   ((xml_node *)CONCAT71(in_register_00000009,delimiter),(char_t *)this,
                    (char_t)path.len);
  }
  return (xml_node)(xml_node)path_local._4_8_;
}

Assistant:

xml_node xml_node__first_element_by_path(NULLCArray path, char delimiter, xml_node* ptr)
	{
		if(!path.ptr)
		{
			nullcThrowError("path is empty");
			return xml_node();
		}
		xml_node ret;
		ret.node = ptr->node.first_element_by_path(path.ptr, delimiter);
		return ret;
	}